

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

unsigned_short __thiscall Am_Instance_Iterator::Length(Am_Instance_Iterator *this)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object_Data **ppAVar3;
  unsigned_short uVar4;
  
  pAVar2 = (this->prototype).data;
  if ((pAVar2 == (Am_Object_Data *)0x0) || ((pAVar2->data).data == (char *)0x0)) {
    uVar4 = 0;
  }
  else {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
    pAVar2 = Am_Object_Data::Narrow(&pAVar2->super_Am_Wrapper);
    uVar4 = 0;
    for (ppAVar3 = &pAVar2->first_instance; *ppAVar3 != (Am_Object_Data *)0x0;
        ppAVar3 = &(*ppAVar3)->next_instance) {
      uVar4 = uVar4 + 1;
    }
    Am_Wrapper::Release(&pAVar2->super_Am_Wrapper);
  }
  return uVar4;
}

Assistant:

bool
Am_Object::Valid() const
{
  return (data != nullptr) && (data->data.data != nullptr);
}